

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNTree.cc
# Opt level: O0

void __thiscall NNTreeIterator::NNTreeIterator(NNTreeIterator *this,NNTreeImpl *impl)

{
  NNTreeImpl *impl_local;
  NNTreeIterator *this_local;
  
  this->_vptr_NNTreeIterator = (_func_int **)&PTR__NNTreeIterator_0058bf40;
  this->impl = impl;
  std::__cxx11::list<NNTreeIterator::PathElement,_std::allocator<NNTreeIterator::PathElement>_>::
  list(&this->path);
  QPDFObjectHandle::QPDFObjectHandle(&this->node);
  this->item_number = -1;
  std::pair<QPDFObjectHandle,_QPDFObjectHandle>::pair<QPDFObjectHandle,_QPDFObjectHandle,_true>
            (&this->ivalue);
  return;
}

Assistant:

NNTreeIterator::NNTreeIterator(NNTreeImpl& impl) :
    impl(impl),
    item_number(-1)
{
}